

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

int sat_solver_clause_new(sat_solver *s,lit *begin,lit *end,int learnt)

{
  uint *puVar1;
  ABC_INT64_T *pAVar2;
  long *plVar3;
  clause cVar4;
  uint uVar5;
  uint h;
  uint uVar6;
  clause *c;
  uint uVar7;
  int in_R8D;
  int nSize;
  long lVar8;
  
  lVar8 = (long)end - (long)begin >> 2;
  if (lVar8 < 2) {
    __assert_fail("end - begin > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21a,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (1 < (uint)learnt) {
    __assert_fail("learnt >= 0 && learnt < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  nSize = (int)lVar8;
  if (nSize == 2 && learnt == 0) {
    veci_push(s->wlists + ((long)*begin ^ 1),begin[1] * 2 + 1);
    veci_push(s->wlists + ((long)begin[1] ^ 1),*begin * 2 + 1);
    puVar1 = &(s->stats).clauses;
    *puVar1 = *puVar1 + 1;
    pAVar2 = &(s->stats).clauses_literals;
    *pAVar2 = *pAVar2 + 2;
    return 0;
  }
  h = Sat_MemAppend(&s->Mem,begin,nSize,learnt,in_R8D);
  if ((h & 1) != 0) {
    __assert_fail("!(h & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x22b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if ((learnt == 0) || (s->hLearnts != -1)) {
    if (learnt == 0) {
      puVar1 = &(s->stats).clauses;
      *puVar1 = *puVar1 + 1;
      lVar8 = 0x1c0;
      goto LAB_00465511;
    }
  }
  else {
    s->hLearnts = h;
  }
  c = Sat_MemClauseHand(&s->Mem,h);
  uVar6 = sat_clause_compute_lbd(s,c);
  cVar4 = *c;
  *c = (clause)(((uint)cVar4 & 0xfffff807) + (uVar6 & 0xff) * 8);
  if (c[(ulong)((uint)cVar4 >> 0xb) + 1] != (clause)(s->act_clas).size) {
    __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x232,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (s->ClaActType == 0) {
    uVar6 = 0x400;
  }
  else {
    uVar6 = s->cla_inc;
  }
  veci_push(&s->act_clas,uVar6);
  puVar1 = &(s->stats).learnts;
  *puVar1 = *puVar1 + 1;
  lVar8 = 0x1c8;
LAB_00465511:
  plVar3 = (long *)((long)(s->Mem).nEntries + lVar8 + -0x10);
  *plVar3 = *plVar3 + (long)(int)((ulong)((long)end - (long)begin) >> 2);
  uVar6 = *begin;
  if ((int)uVar6 < 0) {
    __assert_fail("begin[0] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x242,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  uVar7 = s->size * 2;
  if ((int)uVar7 <= (int)uVar6) {
    __assert_fail("begin[0] < s->size*2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x243,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  uVar5 = begin[1];
  if ((int)uVar5 < 0) {
    __assert_fail("begin[1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x244,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (uVar5 < uVar7) {
    if (uVar7 <= (uint)((ulong)uVar6 ^ 1)) {
      __assert_fail("lit_neg(begin[0]) < s->size*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x247,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    if ((uVar5 ^ 1) < uVar7) {
      uVar7 = uVar5 * 2 + 1;
      if (2 < nSize) {
        uVar7 = h;
      }
      veci_push(s->wlists + ((ulong)uVar6 ^ 1),uVar7);
      uVar6 = h;
      if (nSize < 3) {
        uVar6 = *begin * 2 + 1;
      }
      veci_push(s->wlists + ((long)begin[1] ^ 1),uVar6);
      return h;
    }
    __assert_fail("lit_neg(begin[1]) < s->size*2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x248,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  __assert_fail("begin[1] < s->size*2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                ,0x245,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
}

Assistant:

int sat_solver_clause_new(sat_solver* s, lit* begin, lit* end, int learnt)
{
    int fUseBinaryClauses = 1;
    int size;
    clause* c;
    int h;

    assert(end - begin > 1);
    assert(learnt >= 0 && learnt < 2);
    size           = end - begin;

    // do not allocate memory for the two-literal problem clause
    if ( fUseBinaryClauses && size == 2 && !learnt )
    {
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(clause_from_lit(begin[1])));
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(clause_from_lit(begin[0])));
        s->stats.clauses++;
        s->stats.clauses_literals += size;
        return 0;
    }

    // create new clause
//    h = Vec_SetAppend( &s->Mem, NULL, size + learnt + 1 + 1 ) << 1;
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 0 );
    assert( !(h & 1) );
    if ( s->hLearnts == -1 && learnt )
        s->hLearnts = h;
    if (learnt)
    {
        c = clause_read( s, h );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
//        veci_push(&s->learned, h);
//        act_clause_bump(s,clause_read(s, h));
        if ( s->ClaActType == 0 )
            veci_push(&s->act_clas, (1<<10));
        else
            veci_push(&s->act_clas, s->cla_inc);
        s->stats.learnts++;
        s->stats.learnts_literals += size;
    }
    else
    {
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }

    assert(begin[0] >= 0);
    assert(begin[0] < s->size*2);
    assert(begin[1] >= 0);
    assert(begin[1] < s->size*2);

    assert(lit_neg(begin[0]) < s->size*2);
    assert(lit_neg(begin[1]) < s->size*2);

    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),c);
    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),c);
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(size > 2 ? h : clause_from_lit(begin[1])));
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(size > 2 ? h : clause_from_lit(begin[0])));

    return h;
}